

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArraySegment.cpp
# Opt level: O2

uint32 __thiscall
Js::SparseArraySegmentBase::RemoveUndefined
          (SparseArraySegmentBase *this,ScriptContext *scriptContext)

{
  RecyclableObject *undefined;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type TVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint local_38;
  uint32 local_34 [2];
  uint32 countUndefined;
  
  TVar6 = this->length;
  if (TVar6 == 0) {
    local_34[0] = 0;
  }
  else {
    undefined = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
    local_34[0] = 0;
    for (local_38 = 0; uVar8 = TVar6 - 1, local_38 <= uVar8; local_38 = local_38 + 1) {
      uVar7 = (ulong)uVar8;
      for (uVar11 = (ulong)local_38; uVar7 != uVar11; uVar11 = uVar11 + 1) {
        bVar2 = IsMissingOrUndefined(*(Var *)(&this[1].left + uVar11 * 2),undefined,local_34);
        if (bVar2) {
          bVar2 = uVar11 < uVar7;
          uVar9 = uVar11 & 0xffffffff;
          local_38 = (uint)uVar11;
          goto LAB_00becdfa;
        }
      }
      bVar2 = false;
      uVar9 = uVar7;
      local_38 = uVar8;
LAB_00becdfa:
      lVar12 = 0;
      lVar13 = 0;
      while( true ) {
        iVar10 = (int)lVar12;
        if (uVar7 + lVar12 <= uVar9) {
          if (iVar10 + ((TVar6 - 1) - local_38) != 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                        ,0x6f,"(i == j)","i == j");
            if (!bVar3) goto LAB_00bed02c;
            *puVar5 = 0;
          }
          if (!bVar2) {
            uVar7 = (ulong)(TVar6 - 1) + lVar12;
            uVar8 = (uint)uVar7;
            bVar2 = IsMissingOrUndefined
                              (*(Var *)(&this[1].left + (uVar7 & 0xffffffff) * 2),undefined,local_34
                              );
            if (!bVar2) goto LAB_00becef9;
          }
          uVar8 = (TVar6 + iVar10) - 2;
          goto LAB_00becef9;
        }
        bVar3 = IsMissingOrUndefined
                          (*(Var *)(&this[1].left + uVar7 * 2 + lVar12 * 2),undefined,local_34);
        if (!bVar3) break;
        lVar13 = lVar13 + 8;
        lVar12 = lVar12 + -1;
      }
      TVar6 = uVar8 + iVar10;
      Memory::WriteBarrierPtr<void>::operator=
                ((WriteBarrierPtr<void> *)(&this[1].left + uVar9 * 2),
                 (WriteBarrierPtr<void> *)((long)this + ((uVar7 * 8 + 0x18) - lVar13)));
    }
LAB_00becef9:
    uVar4 = this->length;
    if (uVar8 != uVar4 - 1) {
      uVar8 = uVar8 + 1;
      if (uVar4 <= uVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                    ,0x7b,"(newLen < length)","newLen < length");
        if (!bVar2) goto LAB_00bed02c;
        *puVar5 = 0;
        uVar4 = this->length;
      }
      if (uVar4 - uVar8 < local_34[0]) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                    ,0x7c,"(countUndefined <= length - newLen)",
                                    "countUndefined <= length - newLen");
        if (!bVar2) goto LAB_00bed02c;
        *puVar5 = 0;
      }
      SparseArraySegment<void_*>::Truncate((SparseArraySegment<void_*> *)this,uVar8 + this->left);
      uVar4 = this->length;
    }
    if (this->size < uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SparseArraySegment.cpp"
                                  ,0x80,"(length <= size)","length <= size");
      if (!bVar2) {
LAB_00bed02c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  return local_34[0];
}

Assistant:

uint32 SparseArraySegmentBase::RemoveUndefined(ScriptContext* scriptContext)
    {
        SparseArraySegment<Var> *_this = (SparseArraySegment<Var>*)this;
        // Shortcut length==0, otherwise the code below will AV when left==length==0. (WOOB 1114975)
        if (length == 0)
        {
            return 0;
        }

        //remove undefine values
        RecyclableObject *undefined = scriptContext->GetLibrary()->GetUndefined();

        uint32 i = 0;
        uint32 j = length - 1;
        uint32 countUndefined = 0;

        while (i <= j)
        {
            //get the first null/undefined slot from left
            while (i < j && !IsMissingOrUndefined(_this->elements[i], undefined, countUndefined))
            {
                i++;
            }
            bool iIsMissingOrUndefined = (i < j); // Flag to avoid test again if later j comes down to == i

            //get the first slot which is not null/undefined from the right
            while (i < j && IsMissingOrUndefined(_this->elements[j], undefined, countUndefined))
            {
                j--;
            }

            if (i < j)
            {
                //move
                _this->elements[i] = _this->elements[j];
                i++;
                j--;
            }
            else
            {
                Assert(i == j);
                if (iIsMissingOrUndefined || IsMissingOrUndefined(_this->elements[j], undefined, countUndefined))
                {
                    j--; // ok if j becomes -1. We'll truncate to length (j + 1).
                }
                break; // done
            }
        }

        if (j != length - 1) // Truncate if j has changed
        {
            uint32 newLen = j + 1;
            Assert(newLen < length);
            Assert(countUndefined <= length - newLen);

            _this->Truncate(left + newLen); // Truncate to new length (also clears moved elements)
        }
        AssertOrFailFast(length <= size);

        return countUndefined;
    }